

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool store_reg_kind(DisasContext_conflict1 *s,int rd,TCGv_i32 val,StoreRegKind kind)

{
  undefined1 uVar1;
  uintptr_t o;
  
  uVar1 = (*(code *)(&DAT_00b833ec + *(int *)(&DAT_00b833ec + (ulong)kind * 4)))();
  return (_Bool)uVar1;
}

Assistant:

static bool store_reg_kind(DisasContext *s, int rd,
                            TCGv_i32 val, StoreRegKind kind)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    switch (kind) {
    case STREG_NONE:
        tcg_temp_free_i32(tcg_ctx, val);
        return true;
    case STREG_NORMAL:
        /* See ALUWritePC: Interworking only from a32 mode. */
        if (s->thumb) {
            store_reg(s, rd, val);
        } else {
            store_reg_bx(s, rd, val);
        }
        return true;
    case STREG_SP_CHECK:
        store_sp_checked(s, val);
        return true;
    case STREG_EXC_RET:
        gen_exception_return(s, val);
        return true;
    }
    g_assert_not_reached();
    // never reach here
    return true;
}